

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Ignored __thiscall
re2::CaptureNamesWalker::PreVisit(CaptureNamesWalker *this,Regexp *re,Ignored ignored,bool *stop)

{
  RegexpOp RVar1;
  string *psVar2;
  void *pvVar3;
  mapped_type *this_00;
  Ignored in_EDX;
  Regexp *in_RSI;
  key_type_conflict *in_RDI;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *unaff_retaddr;
  key_type_conflict *__k;
  
  __k = in_RDI;
  RVar1 = Regexp::op(in_RSI);
  if (RVar1 == kRegexpCapture) {
    psVar2 = Regexp::name_abi_cxx11_(in_RSI);
    if (psVar2 != (string *)0x0) {
      if (*(long *)(in_RDI + 6) == 0) {
        pvVar3 = operator_new(0x30);
        std::
        map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)0x22db77);
        *(void **)(in_RDI + 6) = pvVar3;
      }
      psVar2 = Regexp::name_abi_cxx11_(in_RSI);
      Regexp::cap(in_RSI);
      this_00 = std::
                map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](unaff_retaddr,__k);
      std::__cxx11::string::operator=((string *)this_00,(string *)psVar2);
    }
  }
  return in_EDX;
}

Assistant:

Ignored PreVisit(Regexp* re, Ignored ignored, bool* stop) {
    if (re->op() == kRegexpCapture && re->name() != NULL) {
      // Allocate map once we find a name.
      if (map_ == NULL)
        map_ = new std::map<int, std::string>;

      (*map_)[re->cap()] = *re->name();
    }
    return ignored;
  }